

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_average_down_boundaries(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  uint ncomp;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FabFactory<amrex::FArrayBox> *pFVar5;
  uint uVar6;
  FabArray<amrex::FArrayBox> *pFVar7;
  bool bVar8;
  FabType FVar9;
  int iVar10;
  long lVar11;
  FabArray<amrex::EBCellFlagFab> *pFVar12;
  MultiCutFab *this;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  Periodicity *period;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  DistributionMapping *this_00;
  long lVar28;
  int iVar29;
  void *__s;
  int iVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  int local_3c4;
  long local_380;
  Box local_36c;
  FabArray<amrex::FArrayBox> *local_350;
  ulong local_348;
  long local_340;
  long local_338;
  long local_330;
  size_t local_328;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  Box result;
  undefined4 uStack_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined1 local_248 [24];
  pointer local_230;
  undefined8 uStack_228;
  int local_220;
  Array4<const_double> local_208;
  MFItInfo local_1c4;
  MFIter mfi;
  
  ncomp = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  pFVar5 = (fine->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar5 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar11 = __dynamic_cast(pFVar5,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0), lVar11 == 0)) {
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = ngcrse;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = ngcrse;
    mfi.fabArray._0_4_ = ngcrse;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&crse->super_FabArray<amrex::FArrayBox>,0.0,0,ncomp,(IntVect *)&mfi);
  }
  else {
    iVar1 = ratio->vect[0];
    iVar2 = ratio->vect[1];
    iVar3 = ratio->vect[2];
    lVar11 = __dynamic_cast(pFVar5,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar11 == 0) {
      __cxa_bad_cast();
    }
    pFVar12 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar11 + 0xd8));
    local_350 = &crse->super_FabArray<amrex::FArrayBox>;
    this = EBDataCollection::getBndryArea(*(EBDataCollection **)(lVar11 + 0xd8));
    pFVar7 = local_350;
    this_00 = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
    bVar8 = DistributionMapping::operator==
                      (this_00,&(local_350->super_FabArrayBase).distributionMap);
    if ((bVar8) &&
       ((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (pFVar7->super_FabArrayBase).boxarray.m_ref.
        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
      local_1c4.num_streams = Gpu::Device::max_gpu_streams;
      local_1c4.do_tiling = true;
      local_1c4.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
      local_1c4.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
      local_1c4.tilesize.vect[2] = DAT_00810ec0;
      local_1c4.dynamic = true;
      local_1c4.device_sync = true;
      MFIter::MFIter(&mfi,&pFVar7->super_FabArrayBase,&local_1c4);
      iVar4 = ngcrse;
      if (mfi.currentIndex < mfi.endIndex) {
        do {
          local_31c = iVar4;
          MFIter::growntilebox(&local_36c,&mfi,local_31c);
          piVar13 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + mfi.currentIndex;
          }
          result.smallend.vect[1] = local_36c.smallend.vect[1];
          result.smallend.vect[0] = local_36c.smallend.vect[0];
          result.bigend.vect[1] = local_36c.bigend.vect[1];
          result.bigend.vect[2] = local_36c.bigend.vect[2];
          result.btype.itype = local_36c.btype.itype;
          result.smallend.vect[2] = local_36c.smallend.vect[2];
          result.bigend.vect[0] = local_36c.bigend.vect[0];
          iVar4 = ratio->vect[0];
          iVar25 = ratio->vect[1];
          iVar21 = ratio->vect[2];
          if (iVar21 != 1 || (iVar25 != 1 || iVar4 != 1)) {
            uVar6 = (uint)((local_36c.btype.itype & 2) == 0);
            result.smallend.vect[1] = local_36c.smallend.vect[1] * iVar25;
            result.smallend.vect[0] = local_36c.smallend.vect[0] * iVar4;
            result.smallend.vect[2] = local_36c.smallend.vect[2] * iVar21;
            uVar23 = (uint)((local_36c.btype.itype & 4) == 0);
            result.bigend.vect[0] =
                 (local_36c.bigend.vect[0] + (~local_36c.btype.itype & 1)) * iVar4 -
                 (~local_36c.btype.itype & 1);
            result.bigend.vect[1] = (local_36c.bigend.vect[1] + uVar6) * iVar25 - uVar6;
            result.bigend.vect[2] = (local_36c.bigend.vect[2] + uVar23) * iVar21 - uVar23;
          }
          FVar9 = EBCellFlagFab::getType
                            ((pFVar12->m_fabs_v).
                             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[*piVar13],&result);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&result,local_350,&mfi);
          iVar29 = local_36c.bigend.vect[2];
          iVar30 = local_36c.bigend.vect[0];
          iVar21 = local_36c.smallend.vect[2];
          iVar25 = local_36c.smallend.vect[1];
          iVar4 = local_36c.smallend.vect[0];
          if ((uint)(FVar9 + singlevalued) < 2) {
            if (0 < (int)ncomp) {
              lVar11 = (long)local_36c.smallend.vect[1];
              local_338 = (long)local_36c.smallend.vect[0] << 3;
              local_328 = (ulong)(uint)(local_36c.bigend.vect[0] - local_36c.smallend.vect[0]) * 8 +
                          8;
              local_330 = CONCAT44(local_330._4_4_,local_36c.bigend.vect[1]);
              local_340 = CONCAT44(local_340._4_4_,
                                   (local_36c.bigend.vect[1] - local_36c.smallend.vect[1]) + 1);
              local_380 = 0;
              uVar14 = 0;
              do {
                local_348 = uVar14;
                iVar10 = iVar21;
                if (iVar21 <= iVar29) {
                  do {
                    if (iVar25 <= (int)local_330) {
                      lVar17 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
                      __s = (void *)(CONCAT44(uStack_2cc,result.btype.itype) * local_380 +
                                     (lVar11 - (int)local_2c4) * lVar17 +
                                     (long)(iVar10 - local_2c0) *
                                     CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                     (long)(int)local_2c8 * -8 +
                                    result.smallend.vect._0_8_ + local_338);
                      iVar27 = (int)local_340;
                      do {
                        if (iVar4 <= iVar30) {
                          memset(__s,0,local_328);
                        }
                        __s = (void *)((long)__s + lVar17);
                        iVar27 = iVar27 + -1;
                      } while (iVar27 != 0);
                    }
                    bVar8 = iVar10 != iVar29;
                    iVar10 = iVar10 + 1;
                  } while (bVar8);
                }
                uVar14 = local_348 + 1;
                local_380 = local_380 + 8;
              } while (uVar14 != ncomp);
            }
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)local_248,&fine->super_FabArray<amrex::FArrayBox>,
                       &mfi);
            MultiCutFab::const_array(&local_208,this,&mfi);
            if (local_36c.smallend.vect[2] <= local_36c.bigend.vect[2]) {
              local_30c = iVar1 * local_36c.smallend.vect[0];
              local_314 = iVar2 * local_36c.smallend.vect[1];
              local_318 = (local_36c.smallend.vect[1] + 1) * iVar2;
              iVar25 = iVar3 * local_36c.smallend.vect[2];
              local_3c4 = (local_36c.smallend.vect[2] + 1) * iVar3;
              local_2fc = local_36c.bigend.vect[0] + 1;
              local_308 = local_36c.bigend.vect[1] + 1;
              local_304 = local_36c.smallend.vect[0];
              iVar4 = local_36c.smallend.vect[2];
              do {
                lVar11 = (long)iVar25;
                if (local_36c.smallend.vect[1] <= local_36c.bigend.vect[1]) {
                  local_2ec = iVar4 * iVar3;
                  local_310 = iVar4 + 1;
                  local_2f0 = local_310 * iVar3;
                  iVar30 = local_318;
                  iVar29 = local_314;
                  iVar21 = local_36c.smallend.vect[1];
                  do {
                    lVar17 = (long)iVar29;
                    if (local_36c.smallend.vect[0] <= local_36c.bigend.vect[0]) {
                      local_300 = iVar21 + 1;
                      iVar27 = local_30c;
                      iVar10 = local_36c.smallend.vect[0];
                      do {
                        if (0 < (int)ncomp) {
                          local_338 = (long)iVar27 * 8;
                          local_2f8 = iVar10 + 1;
                          local_340 = CONCAT44(uStack_2cc,result.btype.itype);
                          local_348 = ((long)iVar21 - (long)(int)local_2c4) *
                                      CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                      result.smallend.vect._0_8_ +
                                      ((long)iVar10 - (long)(int)local_2c8) * 8 +
                                      ((long)iVar4 - (long)(int)local_2c0) *
                                      CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
                          lVar19 = 0;
                          uVar14 = 0;
                          do {
                            dVar33 = 0.0;
                            if (local_2ec < local_2f0) {
                              local_328 = local_208.kstride * 8;
                              lVar22 = CONCAT44(local_208.jstride._4_4_,(int)local_208.jstride) * 8;
                              lVar26 = (long)local_208.p +
                                       (lVar17 - local_208.begin.y) * lVar22 +
                                       (lVar11 - local_208.begin.z) * local_328 +
                                       (long)local_208.begin.x * -8 + local_338;
                              lVar28 = local_248._0_8_ +
                                       (long)local_230 * lVar19 +
                                       (lVar17 - uStack_228._4_4_) * local_248._8_8_ * 8 +
                                       (lVar11 - local_220) * local_248._16_8_ * 8 +
                                       (long)(int)uStack_228 * -8 + local_338;
                              dVar31 = 0.0;
                              dVar32 = 0.0;
                              lVar15 = lVar11;
                              do {
                                lVar16 = lVar26;
                                lVar18 = lVar28;
                                lVar24 = lVar17;
                                if (iVar21 * iVar2 < local_300 * iVar2) {
                                  do {
                                    if (iVar10 * iVar1 < local_2f8 * iVar1) {
                                      lVar20 = 0;
                                      do {
                                        dVar33 = *(double *)(lVar16 + lVar20 * 8);
                                        dVar32 = dVar32 + *(double *)(lVar18 + lVar20 * 8) * dVar33;
                                        dVar31 = dVar31 + dVar33;
                                        lVar20 = lVar20 + 1;
                                      } while (iVar1 != (int)lVar20);
                                    }
                                    lVar24 = lVar24 + 1;
                                    lVar16 = lVar16 + lVar22;
                                    lVar18 = lVar18 + local_248._8_8_ * 8;
                                  } while (iVar30 != (int)lVar24);
                                }
                                lVar15 = lVar15 + 1;
                                lVar26 = lVar26 + local_328;
                                lVar28 = lVar28 + local_248._16_8_ * 8;
                              } while (local_3c4 != (int)lVar15);
                              dVar33 = 0.0;
                              local_330 = lVar19;
                              if (1e-30 < dVar31) {
                                dVar33 = dVar32 / dVar31;
                              }
                            }
                            *(double *)(local_348 + local_340 * uVar14 * 8) = dVar33;
                            uVar14 = uVar14 + 1;
                            lVar19 = lVar19 + 8;
                            local_2f4 = iVar27;
                          } while (uVar14 != ncomp);
                        }
                        iVar10 = iVar10 + 1;
                        iVar27 = iVar27 + iVar1;
                      } while (iVar10 != local_2fc);
                    }
                    iVar21 = iVar21 + 1;
                    iVar29 = iVar29 + iVar2;
                    iVar30 = iVar30 + iVar2;
                  } while (iVar21 != local_308);
                }
                iVar4 = iVar4 + 1;
                iVar25 = iVar25 + iVar3;
                local_3c4 = local_3c4 + iVar3;
              } while (iVar4 != local_36c.bigend.vect[2] + 1);
            }
          }
          MFIter::operator++(&mfi);
          iVar4 = local_31c;
        } while (mfi.currentIndex < mfi.endIndex);
      }
      MFIter::~MFIter(&mfi);
    }
    else {
      BoxArray::BoxArray((BoxArray *)&result,
                         &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
      BoxArray::coarsen((BoxArray *)&result,ratio);
      local_248._0_8_ = (double *)0x1;
      local_248._8_8_ = (Arena *)0x0;
      local_248._16_8_ = (pointer)0x0;
      local_230 = (pointer)0x0;
      uStack_228 = (pointer)0x0;
      local_208.p = (double *)&PTR__FabFactory_0080b918;
      MultiFab::MultiFab((MultiFab *)&mfi,(BoxArray *)&result,this_00,ncomp,ngcrse,
                         (MFInfo *)local_248,(FabFactory<amrex::FArrayBox> *)&local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_248 + 0x10));
      EB_average_down_boundaries(fine,(MultiFab *)&mfi,ratio,ngcrse);
      pFVar7 = local_350;
      period = Periodicity::NonPeriodic();
      local_248._4_4_ = ngcrse;
      local_248._0_4_ = ngcrse;
      local_248._8_4_ = ngcrse;
      local_208.p = (double *)CONCAT44(ngcrse,ngcrse);
      local_208.jstride._0_4_ = ngcrse;
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (pFVar7,(FabArray<amrex::FArrayBox> *)&mfi,0,0,ncomp,(IntVect *)local_248,
                 (IntVect *)&local_208,period,COPY,(CPC *)0x0,false);
      MultiFab::~MultiFab((MultiFab *)&mfi);
      BoxArray::~BoxArray((BoxArray *)&result);
    }
  }
  return;
}

Assistant:

void EB_average_down_boundaries (const MultiFab& fine, MultiFab& crse,
                                 const IntVect& ratio, int ngcrse)
{
    int ncomp = crse.nComp();

    if (!fine.hasEBFabFactory())
    {
        crse.setVal(0.0, 0, ncomp, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fine.Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& barea = factory.getBndryArea();

        if (isMFIterSafe(fine, crse))
        {
            MFItInfo info;
            if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(crse, info); mfi.isValid(); ++mfi)
            {
                const Box& tbx = mfi.growntilebox(ngcrse);
                FabType typ = flags[mfi].getType(amrex::refine(tbx,ratio));
                Array4<Real> const& ca = crse.array(mfi);
                if (FabType::covered == typ || FabType::regular == typ) {
                    AMREX_HOST_DEVICE_FOR_4D(tbx,ncomp,i,j,k,n,
                    {
                        ca(i,j,k,n) = 0.0;
                    });
                } else {
                    Array4<Real const> const& fa = fine.const_array(mfi);
                    Array4<Real const> const& ba = barea.const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                    {
                        eb_avgdown_boundaries(i,j,k,fa,0,ca,0,ba,dratio,ncomp);
                    });
                }
            }
        }
        else
        {
            BoxArray cba = fine.boxArray();
            cba.coarsen(ratio);
            MultiFab ctmp(cba, fine.DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            EB_average_down_boundaries(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp, 0, 0, ncomp, ngcrse, ngcrse);
        }
    }
}